

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O3

int expr_donew(expr *expr,int ac,t_atom *av)

{
  long *plVar1;
  ex_ex **ppeVar2;
  size_t sVar3;
  int iVar4;
  _binbuf *x;
  ex_ex *peVar5;
  ex_ex *eptr;
  anon_union_8_5_735de1bb_for_ex_cont *paVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  bool bVar10;
  int exp_strlen;
  char *exp_string;
  int local_3c;
  char *local_38;
  
  memset(expr->exp_var,0,0x960);
  x = binbuf_new();
  binbuf_add(x,ac,av);
  binbuf_gettext(x,&local_38,&local_3c);
  binbuf_free(x);
  local_38 = (char *)resizebytes(local_38,(long)local_3c,(long)local_3c + 1);
  local_38[local_3c] = '\0';
  expr->exp_string = local_38;
  expr->exp_str = local_38;
  expr->exp_nexpr = 0;
  do {
    peVar5 = (ex_ex *)malloc(0xf0);
    if (peVar5 == (ex_ex *)0x0) {
LAB_0019029b:
      eptr = (ex_ex *)0x0;
      post("ex_lex: no mem\n");
      bVar10 = true;
LAB_001902af:
      iVar4 = expr->exp_nexpr;
LAB_001902b2:
      if (0 < iVar4) {
        lVar7 = 0;
        do {
          free(expr->exp_stack[lVar7]);
          expr->exp_stack[lVar7] = (ex_ex *)0x0;
          lVar7 = lVar7 + 1;
        } while (lVar7 < expr->exp_nexpr);
      }
      expr->exp_nexpr = 0;
      iVar4 = 1;
      if (!bVar10) {
        free(eptr);
      }
      goto LAB_001902f7;
    }
    lVar7 = 10;
    lVar8 = 0;
    eptr = peVar5;
    sVar3 = 0;
    do {
      sVar9 = sVar3;
      if (lVar7 <= lVar8) {
        eptr = (ex_ex *)realloc(eptr,(lVar7 * 8 + 0x50) * 3);
        if (eptr == (ex_ex *)0x0) goto LAB_0019029b;
        lVar7 = lVar7 + 10;
        peVar5 = (ex_ex *)((long)&eptr->ex_cont + sVar9);
      }
      iVar4 = getoken(expr,peVar5);
      if (iVar4 != 0) {
        free(eptr);
        bVar10 = true;
        goto LAB_00190296;
      }
      lVar8 = lVar8 + 1;
      plVar1 = &peVar5->ex_type;
      peVar5 = peVar5 + 1;
      sVar3 = sVar9 + 0x18;
    } while (*plVar1 != 0);
    bVar10 = eptr == (ex_ex *)0x0;
    if (bVar10) {
LAB_00190296:
      eptr = (ex_ex *)0x0;
      goto LAB_001902af;
    }
    peVar5 = (ex_ex *)malloc(sVar9 + 0x18);
    iVar4 = expr->exp_nexpr;
    expr->exp_stack[iVar4] = peVar5;
    if (peVar5 == (ex_ex *)0x0) {
      bVar10 = false;
      pd_error(expr,"expr: malloc for expr nodes failed\n");
      goto LAB_001902af;
    }
    *(undefined8 *)((long)&peVar5->ex_type + sVar9) = 0;
    expr->exp_nexpr = iVar4 + 1;
    peVar5 = ex_match(eptr,0);
    iVar4 = expr->exp_nexpr;
    if (100 < (long)iVar4) {
      bVar10 = false;
      pd_error(expr,"expr: too many variables (maximum %d allowed)",100);
      goto LAB_001902af;
    }
    if (peVar5 == (ex_ex *)0x0) {
      bVar10 = false;
      goto LAB_001902b2;
    }
    paVar6 = &ex_parse(expr,eptr,expr->exp_stack[(long)iVar4 + -1],(long *)0x0)->ex_cont;
    if (paVar6 == (anon_union_8_5_735de1bb_for_ex_cont *)0x0) goto LAB_001902af;
    peVar5 = expr->exp_stack[(long)expr->exp_nexpr + -1];
    lVar7 = peVar5->ex_type;
    ppeVar2 = &peVar5->ex_end;
    if (*ppeVar2 != peVar5 && lVar7 != 0) {
      do {
        if (((lVar7 == 3) && ((peVar5->ex_cont).v_int == 0x3001c)) &&
           ((0x15 < (ulong)peVar5[1].ex_type ||
            ((0x202020UL >> (peVar5[1].ex_type & 0x3fU) & 1) == 0)))) {
          bVar10 = false;
          post("Bad left value: ");
          ex_print(peVar5);
          goto LAB_001902af;
        }
        lVar7 = peVar5[1].ex_type;
      } while ((lVar7 != 0) && (peVar5 = peVar5 + 1, peVar5 != *ppeVar2));
    }
    free(eptr);
  } while (*expr->exp_str != '\0');
  paVar6[2].v_vec = (t_float *)nullex.ex_end;
  lVar7 = nullex.ex_type;
  *paVar6 = nullex.ex_cont;
  paVar6[1].v_int = lVar7;
  iVar4 = 0;
LAB_001902f7:
  freebytes(local_38,(long)local_3c + 1);
  return iVar4;
}

Assistant:

int
expr_donew(struct expr *expr, int ac, t_atom *av)
{
        struct ex_ex *list;
        struct ex_ex *ret;
        long max_node = 0;              /* maximum number of nodes needed */
        char *exp_string;
        int exp_strlen;
        t_binbuf *b;
        int i;

        memset(expr->exp_var, 0, MAX_VARS * sizeof (*expr->exp_var));
#ifdef PD
        b = binbuf_new();
        binbuf_add(b, ac, av);
        binbuf_gettext(b, &exp_string, &exp_strlen);
        binbuf_free(b);
#else /* MSP */
 {
    char *buf = getbytes(0), *newbuf;
    int length = 0;
    char string[250];
    t_atom *ap;
    int indx;

    for (ap = av, indx = 0; indx < ac; indx++, ap = ++av) {
        int newlength;

        if ((ap->a_type == A_SEMI || ap->a_type == A_COMMA) &&
                length && buf[length-1] == ' ')
                        length--;
        atom_string(ap, string, 250);
        newlength = length + strlen(string) + 1;
        if (!(newbuf = t_resizebytes(buf, length, newlength)))
                                break;
        buf = newbuf;
        strcpy(buf + length, string);
        length = newlength;
        if (ap->a_type == A_SEMI)
                        buf[length-1] = '\n';
        else
                        buf[length-1] = ' ';
    }

    if (length && buf[length-1] == ' ') {
        if (newbuf = t_resizebytes(buf, length, length-1))
        {
            buf = newbuf;
            length--;
        }
    }
    exp_string = buf;
    exp_strlen  = length;
 }
#endif
        exp_string = (char *)t_resizebytes(exp_string, exp_strlen,exp_strlen+1);
        exp_string[exp_strlen] = 0;
        expr->exp_string = exp_string;
        expr->exp_str = exp_string;
        expr->exp_nexpr = 0;
        ret = (struct ex_ex *) 0;
        /*
         * if ret == 0 it means that we have no expression
         * so we let the pass go through to build a single null stack
         */
        while (*expr->exp_str || !ret) {
                list = ex_lex(expr, &max_node);
                if (!list) {            /* syntax error */
                        goto error;
                }
                expr->exp_stack[expr->exp_nexpr] =
                  (struct ex_ex *)fts_malloc(max_node * sizeof (struct ex_ex));
                                if (!expr->exp_stack[expr->exp_nexpr]) {
                                        post_error( (fts_object_t *) expr,
                                                "expr: malloc for expr nodes failed\n");
                                        goto error;
                                }
                                expr->exp_stack[expr->exp_nexpr][max_node-1].ex_type=0;
                expr->exp_nexpr++;
                ret = ex_match(list, (long)0);
                if (expr->exp_nexpr  > MAX_VARS)
                    /* we cannot exceed MAX_VARS '$' variables */
                {
                        post_error((fts_object_t *) expr,
                            "expr: too many variables (maximum %d allowed)",
                                MAX_VARS);
                        goto error;
                }
                if (!ret)               /* syntax error */
                        goto error;
                ret = ex_parse(expr,
                        list, expr->exp_stack[expr->exp_nexpr - 1], (long *)0);
                if (!ret || ex_checklval(expr->exp_stack[expr->exp_nexpr - 1]))
                        goto error;
                fts_free(list);
        }
        *ret = nullex;
        t_freebytes(exp_string, exp_strlen+1);
        return (0);
error:
        for (i = 0; i < expr->exp_nexpr; i++) {
                fts_free(expr->exp_stack[i]);
                expr->exp_stack[i] = 0;
        }
        expr->exp_nexpr = 0;
        if (list)
                fts_free(list);
        t_freebytes(exp_string, exp_strlen+1);
        return (1);
}